

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffDomain<0>::propagate(AllDiffDomain<0> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  iterator *in_RDI;
  int unaff_retaddr;
  int i_4;
  int i_3;
  int parent_val;
  int next_var;
  iterator i_2;
  int i_1;
  int i;
  int val;
  int var;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffbc;
  Tint *in_stack_ffffffffffffffc0;
  int iVar5;
  int local_14;
  
LAB_001a9902:
  in_RDI[3].forward.var = (IntVar *)(in_RDI + 3);
  for (iVar5 = 0; iVar5 < *(int *)&in_RDI[1].forward.var; iVar5 = iVar5 + 1) {
    iVar2 = Tint::operator_cast_to_int
                      ((Tint *)((long)&(in_RDI[2].forward.var)->super_Var + (long)iVar5 * 0x14 + 4))
    ;
    if (iVar2 < 0) {
      *(int *)&((in_RDI[3].forward.var)->super_Var).super_Branching._vptr_Branching = iVar5;
      in_RDI[3].forward.var =
           (IntVar *)((long)&(in_RDI[2].forward.var)->super_Var + (long)iVar5 * 0x14);
    }
  }
  *(undefined4 *)&((in_RDI[3].forward.var)->super_Var).super_Branching._vptr_Branching = 0xffffffff;
  for (iVar2 = 0; iVar2 < *(int *)&in_RDI[2].view; iVar2 = iVar2 + 1) {
    *(undefined1 *)(*(long *)&in_RDI[2].forward.val + (long)iVar2 * 0x14 + 0x11) = 0;
  }
  do {
    if (*(int *)&in_RDI[3].view < 0) {
      in_RDI[3].forward.val = 0;
      *(undefined4 *)&in_RDI[3].forward.field_0xc = 0xffffffff;
      for (iVar5 = 0; iVar5 < *(int *)&in_RDI[1].forward.var + *(int *)&in_RDI[2].view;
          iVar5 = iVar5 + 1) {
        *(undefined1 *)((long)&(&(in_RDI[2].forward.var)->max)[(long)iVar5 * 5].v + 1) = 0;
      }
      iVar5 = 0;
      while( true ) {
        if (*(int *)&in_RDI[1].forward.var <= iVar5) {
          return true;
        }
        if ((((&(in_RDI[2].forward.var)->max)[(long)iVar5 * 5].v & 0x100) == 0) &&
           (bVar1 = tarjan(_i_4,unaff_retaddr), !bVar1)) break;
        iVar5 = iVar5 + 1;
      }
      return false;
    }
    in_RDI[3].forward.var = (IntVar *)(in_RDI + 3);
    for (local_14 = *(int *)&in_RDI[3].view; -1 < local_14;
        local_14 = *(int *)((long)&(in_RDI[2].forward.var)->super_Var + (long)local_14 * 0x14)) {
      IntView<0>::begin((IntView<0> *)CONCAT44(iVar5,iVar2));
      while( true ) {
        IntView<0>::end((IntView<0> *)CONCAT44(iVar5,iVar2));
        bVar1 = IntView<0>::iterator::operator!=
                          ((iterator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           ,in_RDI);
        if (!bVar1) break;
        iVar3 = IntView<0>::iterator::operator*
                          ((iterator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                          );
        if ((*(byte *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0x11) & 1) == 0) {
          iVar4 = Tint::operator_cast_to_int
                            ((Tint *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 4));
          if (iVar4 < 0) goto LAB_001a9b35;
          *(undefined1 *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14 + 0x11) = 1;
          *(int *)(*(long *)&in_RDI[2].forward.val + (long)iVar3 * 0x14) = local_14;
          *(int *)&((in_RDI[3].forward.var)->super_Var).super_Branching._vptr_Branching = iVar4;
          in_RDI[3].forward.var =
               (IntVar *)((long)&(in_RDI[2].forward.var)->super_Var + (long)iVar4 * 0x14);
        }
        IntView<0>::iterator::operator++
                  ((iterator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
    }
    *(undefined4 *)&((in_RDI[3].forward.var)->super_Var).super_Branching._vptr_Branching =
         0xffffffff;
  } while( true );
LAB_001a9b35:
  while( true ) {
    iVar5 = Tint::operator_cast_to_int
                      ((Tint *)((long)&(in_RDI[2].forward.var)->super_Var +
                               (long)local_14 * 0x14 + 4));
    Tint::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    Tint::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar5 < 0) break;
    local_14 = *(int *)(*(long *)&in_RDI[2].forward.val + (long)iVar5 * 0x14);
  }
  goto LAB_001a9902;
}

Assistant:

bool propagate() override {
		// fprintf(stderr, "AllDiffDomain::propagate()\n");
		//  Edmonds-Karp, loop to find and augment a path
		while (true) {
			int var;
			int val;

			// visit source
			queue_tail = &queue;
			for (int i = 0; i < sz; ++i) {
				if (var_nodes[i].match < 0) {
					*queue_tail = i;
					queue_tail = &var_nodes[i].next;
				}
			}
			*queue_tail = -1;
			for (int i = 0; i < range; ++i) {
				val_nodes[i].mark = false;
			}

			// visit vars, also subsume visit of vals
			while (queue >= 0) {
				queue_tail = &queue;
				for (var = queue; var >= 0; var = var_nodes[var].next) {
					for (typename IntView<U>::iterator i = x[var].begin(); i != x[var].end(); ++i) {
						val = *i;
						if (!val_nodes[val].mark) {
							assert(val != var_nodes[var].match);
							const int next_var = val_nodes[val].match;
							if (next_var < 0) {
								goto augment;
							}

							val_nodes[val].mark = true;
							val_nodes[val].next = var;
							*queue_tail = next_var;
							queue_tail = &var_nodes[next_var].next;
						}
					}
				}
				*queue_tail = -1;
			}

			// no more augmenting paths
			break;

		augment:
			// found an augmenting path
			while (true) {
				const int parent_val = var_nodes[var].match;
				val_nodes[val].match = var;
				var_nodes[var].match = val;
				if (parent_val < 0) {
					break;
				}
				val = parent_val;
				var = val_nodes[val].next;
			}
		}
		// fprintf(stderr, "match");
		// for (int i = 0; i < sz; ++i)
		//  fprintf(stderr, " %d", var_nodes[i].match);
		// fprintf(stderr, "\n");

		index = 0;
		stack = -1;
		for (int i = 0; i < sz + range; ++i) {
			var_nodes[i].mark = false;
		}
		for (int i = 0; i < sz; ++i) {
			if (!var_nodes[i].mark && !tarjan(i)) {
				return false;
			}
		}

		return true;
	}